

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

void __thiscall backend::codegen::Codegen::translate_inst(Codegen *this,OpInst *i)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  Op OVar3;
  Value *v;
  OpCode OVar4;
  Reg RVar5;
  Reg RVar6;
  tuple<arm::Inst_*,_std::default_delete<arm::Inst>_> tVar7;
  _Base_ptr p_Var8;
  _Rb_tree_header *p_Var9;
  bool bVar10;
  _Head_base<0UL,_arm::Inst_*,_false> _Var11;
  ConditionCode cond;
  Value *v_00;
  bool reversed;
  initializer_list<mir::inst::Op> __l;
  set<mir::inst::Op,_std::less<mir::inst::Op>,_std::allocator<mir::inst::Op>_> not_reversible;
  __uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_> local_98;
  anon_class_8_1_a78179b7_conflict8 local_90;
  Operand2 local_88;
  _Rb_tree<mir::inst::Op,_mir::inst::Op,_std::_Identity<mir::inst::Op>,_std::less<mir::inst::Op>,_std::allocator<mir::inst::Op>_>
  local_60;
  
  cVar2 = (i->lhs).field_0x18;
  if ((cVar2 == '\0') && ((i->rhs).field_0x18 != '\0')) {
LAB_00165b43:
    OVar3 = i->op;
    local_88.super_Displayable._vptr_Displayable = (_func_int **)0x500000003;
    local_88.super_variant<arm::RegisterOperand,_int>.super__Variant_base<arm::RegisterOperand,_int>
    .super__Move_assign_alias<arm::RegisterOperand,_int>.
    super__Copy_assign_alias<arm::RegisterOperand,_int>.
    super__Move_ctor_alias<arm::RegisterOperand,_int>.
    super__Copy_ctor_alias<arm::RegisterOperand,_int>.
    super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_first._M_storage.
    super_Displayable._vptr_Displayable = (Displayable)(_func_int **)0x1100000010;
    local_88.super_variant<arm::RegisterOperand,_int>.super__Variant_base<arm::RegisterOperand,_int>
    .super__Move_assign_alias<arm::RegisterOperand,_int>.
    super__Copy_assign_alias<arm::RegisterOperand,_int>.
    super__Move_ctor_alias<arm::RegisterOperand,_int>.
    super__Copy_ctor_alias<arm::RegisterOperand,_int>.
    super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._8_8_ = 0xf00000012;
    __l._M_len = 6;
    __l._M_array = (iterator)&local_88;
    std::set<mir::inst::Op,_std::less<mir::inst::Op>,_std::allocator<mir::inst::Op>_>::set
              ((set<mir::inst::Op,_std::less<mir::inst::Op>,_std::allocator<mir::inst::Op>_> *)
               &local_60,__l,(less<mir::inst::Op> *)&local_90,(allocator_type *)&local_98);
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    p_Var8 = &p_Var1->_M_header;
    for (; (_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_parent !=
           (_Rb_tree_header *)0x0;
        local_60._M_impl.super__Rb_tree_header._M_header._M_parent =
             (&(local_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_left)
             [(int)*(size_t *)(local_60._M_impl.super__Rb_tree_header._M_header._M_parent + 1) <
              (int)OVar3]) {
      if ((int)OVar3 <=
          (int)*(size_t *)(local_60._M_impl.super__Rb_tree_header._M_header._M_parent + 1)) {
        p_Var8 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      }
    }
    p_Var9 = p_Var1;
    if (((_Rb_tree_header *)p_Var8 != p_Var1) &&
       (p_Var9 = (_Rb_tree_header *)p_Var8,
       (int)OVar3 < (int)((_Rb_tree_header *)p_Var8)->_M_node_count)) {
      p_Var9 = p_Var1;
    }
    reversed = p_Var9 == p_Var1;
    std::
    _Rb_tree<mir::inst::Op,_mir::inst::Op,_std::_Identity<mir::inst::Op>,_std::less<mir::inst::Op>,_std::allocator<mir::inst::Op>_>
    ::~_Rb_tree(&local_60);
  }
  else {
    bVar10 = false;
    reversed = false;
    if ((cVar2 != '\0') &&
       (((reversed = bVar10, (i->rhs).field_0x18 != '\0' && ((i->lhs).shift_amount != '\0')) &&
        ((i->rhs).shift_amount == '\0')))) goto LAB_00165b43;
  }
  v_00 = &i->rhs;
  v = &i->lhs;
  if (reversed != false) {
    v_00 = &i->lhs;
    v = &i->rhs;
  }
  switch(i->op) {
  case Add:
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = (i->super_Inst).dest.id;
    local_60._M_impl._0_8_ = &PTR_display_001ee058;
    RVar5 = get_or_alloc_vgp(this,(VarId *)&local_60);
    RVar6 = translate_value_to_reg(this,v);
    translate_value_to_operand2(&local_88,this,v_00);
    tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)operator_new(0x38);
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    std::__detail::__variant::_Move_ctor_base<false,_arm::RegisterOperand,_int>::_Move_ctor_base
              ((_Move_ctor_base<false,_arm::RegisterOperand,_int> *)p_Var1,
               (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)
               &local_88.super_variant<arm::RegisterOperand,_int>);
    local_60._M_impl._0_8_ = &PTR_display_001f0838;
    *(OpCode *)
     ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) = Add;
    *(ConditionCode *)
     ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0xc) = Always;
    *(undefined ***)
     tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
     super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = &PTR_display_001f0908;
    *(Reg *)&(((Inst *)((long)tVar7.
                              super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10))->
             super_Displayable)._vptr_Displayable = RVar5;
    *(Reg *)((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                   super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x14) = RVar6;
    local_90.__lhs =
         (_Copy_ctor_base<false,_arm::RegisterOperand,_int> *)
         ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x20);
    *(undefined1 *)
     &(((Inst *)((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                       super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
      super_Displayable)._vptr_Displayable = 0xff;
    *(char *)&(((Inst *)((long)tVar7.
                               super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                               super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
              super_Displayable)._vptr_Displayable =
         (char)local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
      ::_S_vtable._M_arr[(long)(char)local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1].
      _M_data)(&local_90,(variant<arm::RegisterOperand,_int> *)p_Var1);
    *(undefined ***)
     ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x18) = &PTR_display_001f0838;
    local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
         super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_98);
    _Var11._M_head_impl =
         (Inst *)local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                 super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    break;
  case Sub:
    if (reversed == false) {
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = (i->super_Inst).dest.id;
      local_60._M_impl._0_8_ = &PTR_display_001ee058;
      RVar5 = get_or_alloc_vgp(this,(VarId *)&local_60);
      RVar6 = translate_value_to_reg(this,v);
      translate_value_to_operand2(&local_88,this,v_00);
      tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
      super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)operator_new(0x38);
      p_Var1 = &local_60._M_impl.super__Rb_tree_header;
      std::__detail::__variant::_Move_ctor_base<false,_arm::RegisterOperand,_int>::_Move_ctor_base
                ((_Move_ctor_base<false,_arm::RegisterOperand,_int> *)p_Var1,
                 (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)
                 &local_88.super_variant<arm::RegisterOperand,_int>);
      local_60._M_impl._0_8_ = &PTR_display_001f0838;
      *(OpCode *)
       ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) = Sub;
      *(ConditionCode *)
       ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0xc) = Always;
      *(undefined ***)
       tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
       super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = &PTR_display_001f0908;
      *(Reg *)&(((Inst *)((long)tVar7.
                                super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10))->
               super_Displayable)._vptr_Displayable = RVar5;
      *(Reg *)((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                     super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x14) = RVar6;
      local_90.__lhs =
           (_Copy_ctor_base<false,_arm::RegisterOperand,_int> *)
           ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                  super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x20);
      *(undefined1 *)
       &(((Inst *)((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                         super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
        super_Displayable)._vptr_Displayable = 0xff;
      *(char *)&(((Inst *)((long)tVar7.
                                 super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                 .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
                super_Displayable)._vptr_Displayable =
           (char)local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
        ::_S_vtable._M_arr[(long)(char)local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1]
        ._M_data)(&local_90,(variant<arm::RegisterOperand,_int> *)p_Var1);
      *(undefined ***)
       ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x18) = &PTR_display_001f0838
      ;
      local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
      super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
           (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
           (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
           tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
           super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
      std::
      vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
      ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                  *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_98)
      ;
      _Var11._M_head_impl =
           (Inst *)local_98._M_t.
                   super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                   super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    }
    else {
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = (i->super_Inst).dest.id;
      local_60._M_impl._0_8_ = &PTR_display_001ee058;
      RVar5 = get_or_alloc_vgp(this,(VarId *)&local_60);
      RVar6 = translate_value_to_reg(this,v);
      translate_value_to_operand2(&local_88,this,v_00);
      tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
      super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)operator_new(0x38);
      p_Var1 = &local_60._M_impl.super__Rb_tree_header;
      std::__detail::__variant::_Move_ctor_base<false,_arm::RegisterOperand,_int>::_Move_ctor_base
                ((_Move_ctor_base<false,_arm::RegisterOperand,_int> *)p_Var1,
                 (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)
                 &local_88.super_variant<arm::RegisterOperand,_int>);
      local_60._M_impl._0_8_ = &PTR_display_001f0838;
      *(OpCode *)
       ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) = Rsb;
      *(ConditionCode *)
       ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0xc) = Always;
      *(undefined ***)
       tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
       super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = &PTR_display_001f0908;
      *(Reg *)&(((Inst *)((long)tVar7.
                                super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10))->
               super_Displayable)._vptr_Displayable = RVar5;
      *(Reg *)((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                     super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x14) = RVar6;
      local_90.__lhs =
           (_Copy_ctor_base<false,_arm::RegisterOperand,_int> *)
           ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                  super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x20);
      *(undefined1 *)
       &(((Inst *)((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                         super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
        super_Displayable)._vptr_Displayable = 0xff;
      *(char *)&(((Inst *)((long)tVar7.
                                 super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                 .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
                super_Displayable)._vptr_Displayable =
           (char)local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
        ::_S_vtable._M_arr[(long)(char)local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1]
        ._M_data)(&local_90,(variant<arm::RegisterOperand,_int> *)p_Var1);
      *(undefined ***)
       ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x18) = &PTR_display_001f0838
      ;
      local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
      super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
           (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
           (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
           tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
           super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
      std::
      vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
      ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                  *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_98)
      ;
      _Var11._M_head_impl =
           (Inst *)local_98._M_t.
                   super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                   super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    }
    break;
  case Mul:
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = (i->super_Inst).dest.id;
    local_60._M_impl._0_8_ = &PTR_display_001ee058;
    RVar5 = get_or_alloc_vgp(this,(VarId *)&local_60);
    RVar6 = translate_value_to_reg(this,v);
    OVar4 = translate_value_to_reg(this,v_00);
    local_88.super_Displayable._vptr_Displayable = (_func_int **)operator_new(0x38);
    ((Inst *)((long)local_88.super_Displayable._vptr_Displayable + 0x20))->op = OVar4;
    *(undefined2 *)&((Inst *)((long)local_88.super_Displayable._vptr_Displayable + 0x20))->cond = 1;
    ((Inst *)local_88.super_Displayable._vptr_Displayable)->op = Mul;
    ((Inst *)local_88.super_Displayable._vptr_Displayable)->cond = Always;
    (((Inst *)local_88.super_Displayable._vptr_Displayable)->super_Displayable)._vptr_Displayable =
         (_func_int **)&PTR_display_001f0908;
    *(Reg *)&(((Inst *)((long)local_88.super_Displayable._vptr_Displayable + 0x10))->
             super_Displayable)._vptr_Displayable = RVar5;
    *(Reg *)((long)&(((Inst *)((long)local_88.super_Displayable._vptr_Displayable + 0x10))->
                    super_Displayable)._vptr_Displayable + 4) = RVar6;
    *(undefined1 *)
     &(((Inst *)((long)local_88.super_Displayable._vptr_Displayable + 0x30))->super_Displayable).
      _vptr_Displayable = 0;
    (((Inst *)((long)local_88.super_Displayable._vptr_Displayable + 0x20))->super_Displayable).
    _vptr_Displayable = (_func_int **)&PTR_display_001f07d8;
    *(undefined ***)&((Inst *)((long)local_88.super_Displayable._vptr_Displayable + 0x10))->op =
         &PTR_display_001f0838;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_88);
    _Var11._M_head_impl = (Inst *)local_88.super_Displayable._vptr_Displayable;
    break;
  case Div:
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = (i->super_Inst).dest.id;
    local_60._M_impl._0_8_ = &PTR_display_001ee058;
    RVar5 = get_or_alloc_vgp(this,(VarId *)&local_60);
    RVar6 = translate_value_to_reg(this,v);
    OVar4 = translate_value_to_reg(this,v_00);
    local_88.super_Displayable._vptr_Displayable = (_func_int **)operator_new(0x38);
    ((Inst *)((long)local_88.super_Displayable._vptr_Displayable + 0x20))->op = OVar4;
    *(undefined2 *)&((Inst *)((long)local_88.super_Displayable._vptr_Displayable + 0x20))->cond = 1;
    ((Inst *)local_88.super_Displayable._vptr_Displayable)->op = SDiv;
    ((Inst *)local_88.super_Displayable._vptr_Displayable)->cond = Always;
    (((Inst *)local_88.super_Displayable._vptr_Displayable)->super_Displayable)._vptr_Displayable =
         (_func_int **)&PTR_display_001f0908;
    *(Reg *)&(((Inst *)((long)local_88.super_Displayable._vptr_Displayable + 0x10))->
             super_Displayable)._vptr_Displayable = RVar5;
    *(Reg *)((long)&(((Inst *)((long)local_88.super_Displayable._vptr_Displayable + 0x10))->
                    super_Displayable)._vptr_Displayable + 4) = RVar6;
    *(undefined1 *)
     &(((Inst *)((long)local_88.super_Displayable._vptr_Displayable + 0x30))->super_Displayable).
      _vptr_Displayable = 0;
    (((Inst *)((long)local_88.super_Displayable._vptr_Displayable + 0x20))->super_Displayable).
    _vptr_Displayable = (_func_int **)&PTR_display_001f07d8;
    *(undefined ***)&((Inst *)((long)local_88.super_Displayable._vptr_Displayable + 0x10))->op =
         &PTR_display_001f0838;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_88);
    _Var11._M_head_impl = (Inst *)local_88.super_Displayable._vptr_Displayable;
    break;
  case MulSh:
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = (i->super_Inst).dest.id;
    local_60._M_impl._0_8_ = &PTR_display_001ee058;
    RVar5 = get_or_alloc_vgp(this,(VarId *)&local_60);
    RVar6 = translate_value_to_reg(this,v);
    OVar4 = translate_value_to_reg(this,v_00);
    local_88.super_Displayable._vptr_Displayable = (_func_int **)operator_new(0x38);
    ((Inst *)((long)local_88.super_Displayable._vptr_Displayable + 0x20))->op = OVar4;
    *(undefined2 *)&((Inst *)((long)local_88.super_Displayable._vptr_Displayable + 0x20))->cond = 1;
    ((Inst *)local_88.super_Displayable._vptr_Displayable)->op = SMMul;
    ((Inst *)local_88.super_Displayable._vptr_Displayable)->cond = Always;
    (((Inst *)local_88.super_Displayable._vptr_Displayable)->super_Displayable)._vptr_Displayable =
         (_func_int **)&PTR_display_001f0908;
    *(Reg *)&(((Inst *)((long)local_88.super_Displayable._vptr_Displayable + 0x10))->
             super_Displayable)._vptr_Displayable = RVar5;
    *(Reg *)((long)&(((Inst *)((long)local_88.super_Displayable._vptr_Displayable + 0x10))->
                    super_Displayable)._vptr_Displayable + 4) = RVar6;
    *(undefined1 *)
     &(((Inst *)((long)local_88.super_Displayable._vptr_Displayable + 0x30))->super_Displayable).
      _vptr_Displayable = 0;
    (((Inst *)((long)local_88.super_Displayable._vptr_Displayable + 0x20))->super_Displayable).
    _vptr_Displayable = (_func_int **)&PTR_display_001f07d8;
    *(undefined ***)&((Inst *)((long)local_88.super_Displayable._vptr_Displayable + 0x10))->op =
         &PTR_display_001f0838;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_88);
    _Var11._M_head_impl = (Inst *)local_88.super_Displayable._vptr_Displayable;
    break;
  case Rem:
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = (i->super_Inst).dest.id;
    local_60._M_impl._0_8_ = &PTR_display_001ee058;
    RVar5 = get_or_alloc_vgp(this,(VarId *)&local_60);
    RVar6 = translate_value_to_reg(this,v);
    translate_value_to_operand2(&local_88,this,v_00);
    tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)operator_new(0x38);
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    std::__detail::__variant::_Move_ctor_base<false,_arm::RegisterOperand,_int>::_Move_ctor_base
              ((_Move_ctor_base<false,_arm::RegisterOperand,_int> *)p_Var1,
               (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)
               &local_88.super_variant<arm::RegisterOperand,_int>);
    local_60._M_impl._0_8_ = &PTR_display_001f0838;
    *(OpCode *)
     ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) = _Mod;
    *(ConditionCode *)
     ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0xc) = Always;
    *(undefined ***)
     tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
     super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = &PTR_display_001f0908;
    *(Reg *)&(((Inst *)((long)tVar7.
                              super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10))->
             super_Displayable)._vptr_Displayable = RVar5;
    *(Reg *)((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                   super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x14) = RVar6;
    local_90.__lhs =
         (_Copy_ctor_base<false,_arm::RegisterOperand,_int> *)
         ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x20);
    *(undefined1 *)
     &(((Inst *)((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                       super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
      super_Displayable)._vptr_Displayable = 0xff;
    *(char *)&(((Inst *)((long)tVar7.
                               super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                               super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
              super_Displayable)._vptr_Displayable =
         (char)local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
      ::_S_vtable._M_arr[(long)(char)local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1].
      _M_data)(&local_90,(variant<arm::RegisterOperand,_int> *)p_Var1);
    *(undefined ***)
     ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x18) = &PTR_display_001f0838;
    local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
         super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_98);
    _Var11._M_head_impl =
         (Inst *)local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                 super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    break;
  case Gt:
    cond = Gt;
    goto LAB_001666f8;
  case Lt:
    cond = Lt;
    goto LAB_001666f8;
  case Gte:
    cond = Ge;
    goto LAB_001666f8;
  case Lte:
    cond = Le;
    goto LAB_001666f8;
  case Eq:
    cond = Equal;
    goto LAB_001666f8;
  case Neq:
    cond = NotEqual;
LAB_001666f8:
    emit_compare(this,&(i->super_Inst).dest,v,v_00,cond,reversed);
    return;
  case And:
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = (i->super_Inst).dest.id;
    local_60._M_impl._0_8_ = &PTR_display_001ee058;
    RVar5 = get_or_alloc_vgp(this,(VarId *)&local_60);
    RVar6 = translate_value_to_reg(this,v);
    translate_value_to_operand2(&local_88,this,v_00);
    tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)operator_new(0x38);
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    std::__detail::__variant::_Move_ctor_base<false,_arm::RegisterOperand,_int>::_Move_ctor_base
              ((_Move_ctor_base<false,_arm::RegisterOperand,_int> *)p_Var1,
               (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)
               &local_88.super_variant<arm::RegisterOperand,_int>);
    local_60._M_impl._0_8_ = &PTR_display_001f0838;
    *(OpCode *)
     ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) = And;
    *(ConditionCode *)
     ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0xc) = Always;
    *(undefined ***)
     tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
     super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = &PTR_display_001f0908;
    *(Reg *)&(((Inst *)((long)tVar7.
                              super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10))->
             super_Displayable)._vptr_Displayable = RVar5;
    *(Reg *)((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                   super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x14) = RVar6;
    local_90.__lhs =
         (_Copy_ctor_base<false,_arm::RegisterOperand,_int> *)
         ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x20);
    *(undefined1 *)
     &(((Inst *)((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                       super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
      super_Displayable)._vptr_Displayable = 0xff;
    *(char *)&(((Inst *)((long)tVar7.
                               super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                               super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
              super_Displayable)._vptr_Displayable =
         (char)local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
      ::_S_vtable._M_arr[(long)(char)local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1].
      _M_data)(&local_90,(variant<arm::RegisterOperand,_int> *)p_Var1);
    *(undefined ***)
     ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x18) = &PTR_display_001f0838;
    local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
         super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_98);
    _Var11._M_head_impl =
         (Inst *)local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                 super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    break;
  case Or:
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = (i->super_Inst).dest.id;
    local_60._M_impl._0_8_ = &PTR_display_001ee058;
    RVar5 = get_or_alloc_vgp(this,(VarId *)&local_60);
    RVar6 = translate_value_to_reg(this,v);
    translate_value_to_operand2(&local_88,this,v_00);
    tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)operator_new(0x38);
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    std::__detail::__variant::_Move_ctor_base<false,_arm::RegisterOperand,_int>::_Move_ctor_base
              ((_Move_ctor_base<false,_arm::RegisterOperand,_int> *)p_Var1,
               (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)
               &local_88.super_variant<arm::RegisterOperand,_int>);
    local_60._M_impl._0_8_ = &PTR_display_001f0838;
    *(OpCode *)
     ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) = Orr;
    *(ConditionCode *)
     ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0xc) = Always;
    *(undefined ***)
     tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
     super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = &PTR_display_001f0908;
    *(Reg *)&(((Inst *)((long)tVar7.
                              super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10))->
             super_Displayable)._vptr_Displayable = RVar5;
    *(Reg *)((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                   super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x14) = RVar6;
    local_90.__lhs =
         (_Copy_ctor_base<false,_arm::RegisterOperand,_int> *)
         ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x20);
    *(undefined1 *)
     &(((Inst *)((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                       super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
      super_Displayable)._vptr_Displayable = 0xff;
    *(char *)&(((Inst *)((long)tVar7.
                               super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                               super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
              super_Displayable)._vptr_Displayable =
         (char)local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
      ::_S_vtable._M_arr[(long)(char)local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1].
      _M_data)(&local_90,(variant<arm::RegisterOperand,_int> *)p_Var1);
    *(undefined ***)
     ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x18) = &PTR_display_001f0838;
    local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
         super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_98);
    _Var11._M_head_impl =
         (Inst *)local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                 super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    break;
  case Xor:
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = (i->super_Inst).dest.id;
    local_60._M_impl._0_8_ = &PTR_display_001ee058;
    RVar5 = get_or_alloc_vgp(this,(VarId *)&local_60);
    RVar6 = translate_value_to_reg(this,v);
    translate_value_to_operand2(&local_88,this,v_00);
    tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)operator_new(0x38);
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    std::__detail::__variant::_Move_ctor_base<false,_arm::RegisterOperand,_int>::_Move_ctor_base
              ((_Move_ctor_base<false,_arm::RegisterOperand,_int> *)p_Var1,
               (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)
               &local_88.super_variant<arm::RegisterOperand,_int>);
    local_60._M_impl._0_8_ = &PTR_display_001f0838;
    *(OpCode *)
     ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) = Eor;
    *(ConditionCode *)
     ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0xc) = Always;
    *(undefined ***)
     tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
     super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = &PTR_display_001f0908;
    *(Reg *)&(((Inst *)((long)tVar7.
                              super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10))->
             super_Displayable)._vptr_Displayable = RVar5;
    *(Reg *)((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                   super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x14) = RVar6;
    local_90.__lhs =
         (_Copy_ctor_base<false,_arm::RegisterOperand,_int> *)
         ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x20);
    *(undefined1 *)
     &(((Inst *)((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                       super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
      super_Displayable)._vptr_Displayable = 0xff;
    *(char *)&(((Inst *)((long)tVar7.
                               super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                               super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
              super_Displayable)._vptr_Displayable =
         (char)local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
      ::_S_vtable._M_arr[(long)(char)local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1].
      _M_data)(&local_90,(variant<arm::RegisterOperand,_int> *)p_Var1);
    *(undefined ***)
     ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x18) = &PTR_display_001f0838;
    local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
         super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_98);
    _Var11._M_head_impl =
         (Inst *)local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                 super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    break;
  case Not:
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = (i->super_Inst).dest.id;
    local_60._M_impl._0_8_ = &PTR_display_001ee058;
    RVar5 = get_or_alloc_vgp(this,(VarId *)&local_60);
    translate_value_to_operand2(&local_88,this,v);
    tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)operator_new(0x38);
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    std::__detail::__variant::_Move_ctor_base<false,_arm::RegisterOperand,_int>::_Move_ctor_base
              ((_Move_ctor_base<false,_arm::RegisterOperand,_int> *)p_Var1,
               (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)
               &local_88.super_variant<arm::RegisterOperand,_int>);
    local_60._M_impl._0_8_ = &PTR_display_001f0838;
    *(OpCode *)
     ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) = Mvn;
    *(ConditionCode *)
     ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0xc) = Always;
    *(undefined ***)
     tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
     super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = &PTR_display_001f0948;
    *(Reg *)&(((Inst *)((long)tVar7.
                              super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10))->
             super_Displayable)._vptr_Displayable = RVar5;
    local_90.__lhs =
         (_Copy_ctor_base<false,_arm::RegisterOperand,_int> *)
         ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x20);
    *(undefined1 *)
     &(((Inst *)((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                       super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
      super_Displayable)._vptr_Displayable = 0xff;
    *(char *)&(((Inst *)((long)tVar7.
                               super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                               super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
              super_Displayable)._vptr_Displayable =
         (char)local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
      ::_S_vtable._M_arr[(long)(char)local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1].
      _M_data)(&local_90,(variant<arm::RegisterOperand,_int> *)p_Var1);
    *(undefined ***)
     ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x18) = &PTR_display_001f0838;
    local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
         super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_98);
    _Var11._M_head_impl =
         (Inst *)local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                 super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    break;
  case Shl:
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = (i->super_Inst).dest.id;
    local_60._M_impl._0_8_ = &PTR_display_001ee058;
    RVar5 = get_or_alloc_vgp(this,(VarId *)&local_60);
    RVar6 = translate_value_to_reg(this,v);
    translate_value_to_operand2(&local_88,this,v_00);
    tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)operator_new(0x38);
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    std::__detail::__variant::_Move_ctor_base<false,_arm::RegisterOperand,_int>::_Move_ctor_base
              ((_Move_ctor_base<false,_arm::RegisterOperand,_int> *)p_Var1,
               (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)
               &local_88.super_variant<arm::RegisterOperand,_int>);
    local_60._M_impl._0_8_ = &PTR_display_001f0838;
    *(OpCode *)
     ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) = Lsl;
    *(ConditionCode *)
     ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0xc) = Always;
    *(undefined ***)
     tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
     super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = &PTR_display_001f0908;
    *(Reg *)&(((Inst *)((long)tVar7.
                              super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10))->
             super_Displayable)._vptr_Displayable = RVar5;
    *(Reg *)((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                   super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x14) = RVar6;
    local_90.__lhs =
         (_Copy_ctor_base<false,_arm::RegisterOperand,_int> *)
         ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x20);
    *(undefined1 *)
     &(((Inst *)((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                       super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
      super_Displayable)._vptr_Displayable = 0xff;
    *(char *)&(((Inst *)((long)tVar7.
                               super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                               super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
              super_Displayable)._vptr_Displayable =
         (char)local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
      ::_S_vtable._M_arr[(long)(char)local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1].
      _M_data)(&local_90,(variant<arm::RegisterOperand,_int> *)p_Var1);
    *(undefined ***)
     ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x18) = &PTR_display_001f0838;
    local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
         super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_98);
    _Var11._M_head_impl =
         (Inst *)local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                 super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    break;
  case Shr:
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = (i->super_Inst).dest.id;
    local_60._M_impl._0_8_ = &PTR_display_001ee058;
    RVar5 = get_or_alloc_vgp(this,(VarId *)&local_60);
    RVar6 = translate_value_to_reg(this,v);
    translate_value_to_operand2(&local_88,this,v_00);
    tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)operator_new(0x38);
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    std::__detail::__variant::_Move_ctor_base<false,_arm::RegisterOperand,_int>::_Move_ctor_base
              ((_Move_ctor_base<false,_arm::RegisterOperand,_int> *)p_Var1,
               (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)
               &local_88.super_variant<arm::RegisterOperand,_int>);
    local_60._M_impl._0_8_ = &PTR_display_001f0838;
    *(OpCode *)
     ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) = Lsr;
    *(ConditionCode *)
     ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0xc) = Always;
    *(undefined ***)
     tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
     super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = &PTR_display_001f0908;
    *(Reg *)&(((Inst *)((long)tVar7.
                              super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10))->
             super_Displayable)._vptr_Displayable = RVar5;
    *(Reg *)((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                   super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x14) = RVar6;
    local_90.__lhs =
         (_Copy_ctor_base<false,_arm::RegisterOperand,_int> *)
         ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x20);
    *(undefined1 *)
     &(((Inst *)((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                       super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
      super_Displayable)._vptr_Displayable = 0xff;
    *(char *)&(((Inst *)((long)tVar7.
                               super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                               super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
              super_Displayable)._vptr_Displayable =
         (char)local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
      ::_S_vtable._M_arr[(long)(char)local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1].
      _M_data)(&local_90,(variant<arm::RegisterOperand,_int> *)p_Var1);
    *(undefined ***)
     ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x18) = &PTR_display_001f0838;
    local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
         super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_98);
    _Var11._M_head_impl =
         (Inst *)local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                 super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    break;
  case ShrA:
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = (i->super_Inst).dest.id;
    local_60._M_impl._0_8_ = &PTR_display_001ee058;
    RVar5 = get_or_alloc_vgp(this,(VarId *)&local_60);
    RVar6 = translate_value_to_reg(this,v);
    translate_value_to_operand2(&local_88,this,v_00);
    tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>)operator_new(0x38);
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    std::__detail::__variant::_Move_ctor_base<false,_arm::RegisterOperand,_int>::_Move_ctor_base
              ((_Move_ctor_base<false,_arm::RegisterOperand,_int> *)p_Var1,
               (_Move_ctor_base<false,_arm::RegisterOperand,_int> *)
               &local_88.super_variant<arm::RegisterOperand,_int>);
    local_60._M_impl._0_8_ = &PTR_display_001f0838;
    *(OpCode *)
     ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) = Asr;
    *(ConditionCode *)
     ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0xc) = Always;
    *(undefined ***)
     tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
     super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = &PTR_display_001f0908;
    *(Reg *)&(((Inst *)((long)tVar7.
                              super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                              super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10))->
             super_Displayable)._vptr_Displayable = RVar5;
    *(Reg *)((long)&(((Inst *)((long)tVar7.
                                     super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                     .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10)
                     )->super_Displayable)._vptr_Displayable + 4) = RVar6;
    local_90.__lhs =
         (_Copy_ctor_base<false,_arm::RegisterOperand,_int> *)
         ((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x20);
    *(undefined1 *)
     &(((Inst *)((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                       super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
      super_Displayable)._vptr_Displayable = 0xff;
    *(char *)&(((Inst *)((long)tVar7.
                               super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                               super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
              super_Displayable)._vptr_Displayable =
         (char)local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_int>_&>
      ::_S_vtable._M_arr[(long)(char)local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1].
      _M_data)(&local_90,(variant<arm::RegisterOperand,_int> *)p_Var1);
    *(undefined ***)
     &((Inst *)((long)tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                      super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10))->op =
         &PTR_display_001f0838;
    local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         (tuple<arm::Inst_*,_std::default_delete<arm::Inst>_>)
         tVar7.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
         super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_98);
    _Var11._M_head_impl =
         (Inst *)local_98._M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                 super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    break;
  default:
    goto switchD_00165bfd_default;
  }
  if ((_Head_base<0UL,_arm::Inst_*,_false>)_Var11._M_head_impl !=
      (_Head_base<0UL,_arm::Inst_*,_false>)0x0) {
    (*((_Var11._M_head_impl)->super_Displayable)._vptr_Displayable[2])();
  }
switchD_00165bfd_default:
  return;
}

Assistant:

void Codegen::translate_inst(mir::inst::OpInst& i) {
  // Reverse when:
  //  - lhs is immediate
  //  - lhs is variable with shift and rhs is regular variable
  bool reverse_params = ((i.lhs.is_immediate() && !i.rhs.is_immediate()) ||
                         (!i.lhs.is_immediate() && !i.rhs.is_immediate() &&
                          i.lhs.has_shift() && !i.rhs.has_shift())) &&
                        can_reverse_param(i.op);

  mir::inst::Value& lhs = reverse_params ? i.rhs : i.lhs;
  mir::inst::Value& rhs = reverse_params ? i.lhs : i.rhs;

  switch (i.op) {
    case mir::inst::Op::Add:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::Add, translate_var_reg(i.dest),
          translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      break;

    case mir::inst::Op::Sub:
      if (reverse_params) {
        inst.push_back(std::make_unique<Arith3Inst>(
            arm::OpCode::Rsb, translate_var_reg(i.dest),
            translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      } else {
        inst.push_back(std::make_unique<Arith3Inst>(
            arm::OpCode::Sub, translate_var_reg(i.dest),
            translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      }
      break;

    case mir::inst::Op::Mul:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::Mul, translate_var_reg(i.dest),
          translate_value_to_reg(lhs),
          RegisterOperand(translate_value_to_reg(rhs))));
      break;

    case mir::inst::Op::MulSh:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::SMMul, translate_var_reg(i.dest),
          translate_value_to_reg(lhs),
          RegisterOperand(translate_value_to_reg(rhs))));
      break;

    case mir::inst::Op::Div:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::SDiv, translate_var_reg(i.dest),
          translate_value_to_reg(lhs),
          RegisterOperand(translate_value_to_reg(rhs))));
      break;

    case mir::inst::Op::And:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::And, translate_var_reg(i.dest),
          translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      break;

    case mir::inst::Op::Or:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::Orr, translate_var_reg(i.dest),
          translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      break;

    case mir::inst::Op::Xor:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::Eor, translate_var_reg(i.dest),
          translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      break;

    case mir::inst::Op::Not:
      inst.push_back(std::make_unique<Arith2Inst>(
          arm::OpCode::Mvn, translate_var_reg(i.dest),
          translate_value_to_operand2(lhs)));
      break;

    case mir::inst::Op::Shl:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::Lsl, translate_var_reg(i.dest),
          translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      break;

    case mir::inst::Op::Shr:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::Lsr, translate_var_reg(i.dest),
          translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      break;

    case mir::inst::Op::ShrA:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::Asr, translate_var_reg(i.dest),
          translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      break;

    case mir::inst::Op::Rem:
      // WARN: Mod is a pseudo-instruction!
      // Mod operations needs to be eliminated in later passes.
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::_Mod, translate_var_reg(i.dest),
          translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      break;
    case mir::inst::Op::Gt:
      emit_compare(i.dest, lhs, rhs, ConditionCode::Gt, reverse_params);
      break;
    case mir::inst::Op::Lt:
      emit_compare(i.dest, lhs, rhs, ConditionCode::Lt, reverse_params);
      break;
    case mir::inst::Op::Gte:
      emit_compare(i.dest, lhs, rhs, ConditionCode::Ge, reverse_params);
      break;
    case mir::inst::Op::Lte:
      emit_compare(i.dest, lhs, rhs, ConditionCode::Le, reverse_params);
      break;
    case mir::inst::Op::Eq:
      emit_compare(i.dest, lhs, rhs, ConditionCode::Equal, reverse_params);
      break;
    case mir::inst::Op::Neq:
      emit_compare(i.dest, lhs, rhs, ConditionCode::NotEqual, reverse_params);
      break;
  }
}